

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O3

iterator_range<llvm::AppleAcceleratorTable::ValueIterator> * __thiscall
llvm::AppleAcceleratorTable::equal_range
          (iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *__return_storage_ptr__,
          AppleAcceleratorTable *this,StringRef Key)

{
  uint uVar1;
  DWARFDataExtractor *this_00;
  uint uVar2;
  uint32_t uVar3;
  int iVar4;
  char *__s;
  SmallVectorStorage<llvm::DWARFFormValue,_3U> *pSVar5;
  size_t __n;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ValueIterator local_548;
  ValueIterator local_480;
  ValueIterator local_3b8;
  ValueIterator local_2f0;
  ValueIterator local_228;
  ValueIterator local_160;
  uint64_t local_98;
  uint64_t BucketOffset;
  uint64_t HashOffset;
  uint64_t OffsetsOffset;
  uint64_t StringOffset;
  DWARFDataExtractor *local_70;
  long local_68;
  DataExtractor *local_60;
  char *local_58;
  ulong local_50;
  uint64_t DataOffset;
  ulong local_40;
  AppleAcceleratorTable *local_38;
  
  __n = Key.Length;
  local_38 = this;
  if (this->IsValid == false) {
    memset(&local_3b8,0,0xb0);
    local_3b8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
    local_3b8.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01077e68;
    local_3b8.Current.HdrData = (HeaderData *)0x0;
    local_3b8.DataOffset = 0;
    local_3b8.Data = 0;
    local_3b8.NumData = 0;
    local_3b8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         &local_3b8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
    memset(&local_2f0,0,0xb0);
    local_2f0.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
    local_2f0.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01077e68;
    local_2f0.Current.HdrData = (HeaderData *)0x0;
    local_2f0.DataOffset = 0;
    local_2f0.Data = 0;
    local_2f0.NumData = 0;
    local_2f0.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         &local_2f0.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
    make_range<llvm::AppleAcceleratorTable::ValueIterator>
              (__return_storage_ptr__,&local_3b8,&local_2f0);
    local_2f0.Current.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_01077f88;
    if ((SmallVectorStorage<llvm::DWARFFormValue,_3U> *)
        local_2f0.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
        super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
        super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX !=
        &local_2f0.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>) {
      free(local_2f0.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
           super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
           super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX)
      ;
    }
    local_3b8.Current.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_01077f88;
    pSVar5 = &local_3b8.Current.super_Entry.Values.
              super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
    local_548.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         local_3b8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
         super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
         super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX;
  }
  else {
    if (__n == 0) {
      uVar2 = 0x1505;
    }
    else {
      uVar2 = 0x1505;
      sVar6 = 0;
      do {
        uVar2 = uVar2 * 0x21 + (uint)(byte)Key.Data[sVar6];
        sVar6 = sVar6 + 1;
      } while (__n != sVar6);
    }
    uVar1 = (this->Hdr).BucketCount;
    local_40 = (ulong)(this->Hdr).HashCount;
    StringOffset = (ulong)uVar2 % (ulong)uVar1;
    uVar7 = (ulong)(this->Hdr).HeaderDataLength;
    local_98 = uVar7 + 0x14 + (ulong)(uint)((int)StringOffset * 4);
    local_70 = &(this->super_DWARFAcceleratorTable).AccelSection;
    local_58 = Key.Data;
    DataOffset = (uint64_t)__return_storage_ptr__;
    uVar3 = DataExtractor::getU32(&local_70->super_DataExtractor,&local_98,(Error *)0x0);
    this_00 = local_70;
    if (uVar3 < (this->Hdr).HashCount) {
      local_68 = uVar7 + (uVar1 << 2) + 0x14;
      local_40 = (ulong)(uint)((int)local_40 << 2) + local_68;
      local_60 = &(this->super_DWARFAcceleratorTable).StringSection;
      uVar8 = (ulong)uVar3;
      uVar7 = uVar8 * 4;
      do {
        BucketOffset = local_68 + (uVar7 & 0xffffffff);
        HashOffset = (uVar7 & 0xffffffff) + local_40;
        uVar3 = DataExtractor::getU32(&this_00->super_DataExtractor,&BucketOffset,(Error *)0x0);
        if (uVar3 % (this->Hdr).BucketCount != (uint)StringOffset) break;
        uVar3 = DataExtractor::getU32(&this_00->super_DataExtractor,&HashOffset,(Error *)0x0);
        local_50 = (ulong)uVar3;
        OffsetsOffset =
             DWARFDataExtractor::getRelocatedValue(this_00,4,&local_50,(uint64_t *)0x0,(Error *)0x0)
        ;
        if (OffsetsOffset == 0) break;
        __s = DataExtractor::getCStr(local_60,&OffsetsOffset);
        if (__s == (char *)0x0) {
          sVar6 = 0;
        }
        else {
          sVar6 = strlen(__s);
        }
        if ((sVar6 == __n) && ((__n == 0 || (iVar4 = bcmp(local_58,__s,__n), iVar4 == 0)))) {
          ValueIterator::ValueIterator(&local_548,local_38,local_50);
          pSVar5 = &local_480.Current.super_Entry.Values.
                    super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
          memset(&local_480,0,0xb0);
          __return_storage_ptr__ =
               (iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *)DataOffset;
          local_480.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
          super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
          super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity
               = 3;
          local_480.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01077e68;
          local_480.Current.HdrData = (HeaderData *)0x0;
          local_480.DataOffset = 0;
          local_480.Data = 0;
          local_480.NumData = 0;
          local_480.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
          super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
          super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
               pSVar5;
          make_range<llvm::AppleAcceleratorTable::ValueIterator>
                    ((iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *)DataOffset,
                     &local_548,&local_480);
          local_480.Current.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_01077f88
          ;
          if ((SmallVectorStorage<llvm::DWARFFormValue,_3U> *)
              local_480.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
              super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
              super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
              BeginX != pSVar5) {
            free(local_480.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
                 super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
                 super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
                 BeginX);
          }
          pSVar5 = &local_548.Current.super_Entry.Values.
                    super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
          local_548.Current.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_01077f88
          ;
          goto LAB_00d49fb3;
        }
        uVar8 = uVar8 + 1;
        uVar7 = uVar7 + 4;
        this = local_38;
      } while (uVar8 < (local_38->Hdr).HashCount);
    }
    memset(&local_228,0,0xb0);
    local_228.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
    local_228.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01077e68;
    local_228.Current.HdrData = (HeaderData *)0x0;
    local_228.DataOffset = 0;
    local_228.Data = 0;
    local_228.NumData = 0;
    local_228.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         &local_228.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
    memset(&local_160,0,0xb0);
    __return_storage_ptr__ =
         (iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *)DataOffset;
    local_160.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
    local_160.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01077e68;
    local_160.Current.HdrData = (HeaderData *)0x0;
    local_160.DataOffset = 0;
    local_160.Data = 0;
    local_160.NumData = 0;
    local_160.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         &local_160.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
    make_range<llvm::AppleAcceleratorTable::ValueIterator>
              ((iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *)DataOffset,&local_228,
               &local_160);
    local_160.Current.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_01077f88;
    if ((SmallVectorStorage<llvm::DWARFFormValue,_3U> *)
        local_160.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
        super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
        super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX !=
        &local_160.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>) {
      free(local_160.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
           super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
           super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX)
      ;
    }
    local_228.Current.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_01077f88;
    pSVar5 = &local_228.Current.super_Entry.Values.
              super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
    local_548.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         local_228.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
         super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
         super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX;
  }
LAB_00d49fb3:
  if ((SmallVectorStorage<llvm::DWARFFormValue,_3U> *)
      local_548.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
      super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
      super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX !=
      pSVar5) {
    free(local_548.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
         super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
         super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator_range<AppleAcceleratorTable::ValueIterator>
AppleAcceleratorTable::equal_range(StringRef Key) const {
  if (!IsValid)
    return make_range(ValueIterator(), ValueIterator());

  // Find the bucket.
  unsigned HashValue = djbHash(Key);
  unsigned Bucket = HashValue % Hdr.BucketCount;
  uint64_t BucketBase = sizeof(Hdr) + Hdr.HeaderDataLength;
  uint64_t HashesBase = BucketBase + Hdr.BucketCount * 4;
  uint64_t OffsetsBase = HashesBase + Hdr.HashCount * 4;

  uint64_t BucketOffset = BucketBase + Bucket * 4;
  unsigned Index = AccelSection.getU32(&BucketOffset);

  // Search through all hashes in the bucket.
  for (unsigned HashIdx = Index; HashIdx < Hdr.HashCount; ++HashIdx) {
    uint64_t HashOffset = HashesBase + HashIdx * 4;
    uint64_t OffsetsOffset = OffsetsBase + HashIdx * 4;
    uint32_t Hash = AccelSection.getU32(&HashOffset);

    if (Hash % Hdr.BucketCount != Bucket)
      // We are already in the next bucket.
      break;

    uint64_t DataOffset = AccelSection.getU32(&OffsetsOffset);
    uint64_t StringOffset = AccelSection.getRelocatedValue(4, &DataOffset);
    if (!StringOffset)
      break;

    // Finally, compare the key.
    if (Key == StringSection.getCStr(&StringOffset))
      return make_range({*this, DataOffset}, ValueIterator());
  }
  return make_range(ValueIterator(), ValueIterator());
}